

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_main.c
# Opt level: O2

int sys_main(int argc,char **argv)

{
  char *__s1;
  __uid_t _Var1;
  __uid_t _Var2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  t_namelist *ptVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  int nmidioutdev;
  int nmidiindev;
  int local_4b0;
  int local_4ac;
  char **local_4a8;
  char *local_4a0;
  int local_498 [16];
  int midiindev [16];
  char sbuf [1000];
  
  sys_externalschedlib = 0;
  sys_extraflags = 0;
  _Var1 = getuid();
  _Var2 = geteuid();
  if (_Var1 != _Var2) {
    fwrite("warning: canceling setuid privilege\n",0x24,1,_stderr);
    _Var1 = getuid();
    setuid(_Var1);
  }
  iVar3 = socket_init();
  if (iVar3 != 0) {
    sys_sockerror("socket_init()");
  }
  pd_init();
  sys_findprogdir(*argv);
  local_4ac = argc + -1;
  uVar7 = 0;
  uVar8 = (ulong)(uint)argc;
  if (argc < 1) {
    uVar8 = uVar7;
  }
  lVar9 = (long)local_4ac;
  local_4a0 = "";
  local_4b0 = 0;
  local_4a8 = argv;
  for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
    __s1 = argv[uVar7];
    iVar3 = strcmp(__s1,"-noprefs");
    if (iVar3 == 0) {
      local_4b0 = 1;
    }
    else {
      iVar3 = strcmp(__s1,"-prefsfile");
      if ((long)uVar7 < lVar9 && iVar3 == 0) {
        local_4a0 = argv[uVar7 + 1];
      }
      else {
        iVar3 = strcmp(__s1,"-schedlib");
        argv = local_4a8;
        if (iVar3 == 0 && (long)uVar7 < lVar9) {
          sys_externalschedlib = 1;
        }
        else if ((((*__s1 == '-') && (__s1[1] == 'h')) && (__s1[2] == '\0')) ||
                (iVar3 = strcmp(__s1,"-help"), iVar3 == 0)) {
          sys_printusage();
          return 1;
        }
      }
    }
  }
  if (local_4b0 == 0) {
    sys_loadpreferences(local_4a0,1);
  }
  iVar4 = sys_argparse(local_4ac,argv + 1);
  iVar3 = 1;
  if (iVar4 == 0) {
    if ((sys_verbose != 0) || ((sys_version & 1) != 0)) {
      fprintf(_stderr,"%s compiled %s %s\n",pd_version,pd_compiletime);
      if (sys_verbose != 0) {
        fprintf(_stderr,"float precision = %lu bits\n",0x20);
      }
      if (sys_version == 1) {
        fflush(_stderr);
        return 0;
      }
    }
    sys_setsignalhandlers();
    nmidiindev = 0;
    nmidioutdev = 0;
    strncpy(sbuf,sys_libdir->s_name,0x3ca);
    uVar7 = 0;
    sbuf[0x3ca] = '\0';
    sVar5 = strlen(sbuf);
    builtin_strncpy(sbuf + sVar5,"/extra",7);
    sys_setextrapath(sbuf);
    strncpy(sbuf,sys_libdir->s_name,0x3ca);
    sbuf[0x3ca] = '\0';
    sVar5 = strlen(sbuf);
    builtin_strncpy(sbuf + sVar5,"/doc/5.reference",0x11);
    ptVar6 = namelist_append_files((pd_maininstance.pd_stuff)->st_helppath,sbuf);
    (pd_maininstance.pd_stuff)->st_helppath = ptVar6;
    uVar8 = (ulong)(uint)sys_nmidiin;
    if (sys_nmidiin < 1) {
      uVar8 = uVar7;
    }
    for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
      sys_midiindevlist[uVar7] = sys_midiindevlist[uVar7] + -1;
    }
    uVar7 = 0;
    uVar8 = (ulong)(uint)sys_nmidiout;
    if (sys_nmidiout < 1) {
      uVar8 = uVar7;
    }
    for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
      sys_midioutdevlist[uVar7] = sys_midioutdevlist[uVar7] + -1;
    }
    if (sys_listplease == '\x01') {
      sys_listdevs();
    }
    sys_get_midi_params(&nmidiindev,midiindev,&nmidioutdev,local_498);
    if (-1 < (long)sys_nmidiin) {
      nmidiindev = sys_nmidiin;
      for (lVar9 = 0; sys_nmidiin != lVar9; lVar9 = lVar9 + 1) {
        midiindev[lVar9] = sys_midiindevlist[lVar9];
      }
    }
    if (-1 < (long)sys_nmidiout) {
      nmidioutdev = sys_nmidiout;
      for (lVar9 = 0; sys_nmidiout != lVar9; lVar9 = lVar9 + 1) {
        local_498[lVar9] = sys_midioutdevlist[lVar9];
      }
    }
    sys_open_midi(nmidiindev,midiindev,nmidioutdev,local_498,0);
    sys_init_audio();
    if (sys_dontstartgui == '\x01') {
      sys_fakefromguiclk = clock_new((void *)0x0,sys_fakefromgui);
      clock_set(sys_fakefromguiclk,0.0);
    }
    else {
      iVar3 = sys_startgui(sys_libdir->s_name);
      if (iVar3 != 0) {
        return 1;
      }
    }
    if (sys_hipriority != 0) {
      sys_setrealtime(sys_libdir->s_name);
    }
    if (sys_externalschedlib == 0) {
      if (sys_batch == '\x01') {
        iVar3 = m_batchmain();
      }
      else {
        sys_reopen_midi();
        iVar3 = audio_shouldkeepopen();
        if (iVar3 != 0) {
          sys_reopen_audio();
        }
        iVar3 = m_mainloop();
      }
    }
    else {
      iVar3 = sys_run_scheduler(sys_externalschedlibname,sys_extraflagsstring);
    }
  }
  return iVar3;
}

Assistant:

int sys_main(int argc, const char **argv)
{
    int i, noprefs;
    const char *prefsfile = "";
    sys_externalschedlib = 0;
    sys_extraflags = 0;
#ifdef PD_DEBUG
    fprintf(stderr, "Pd: COMPILED FOR DEBUGGING\n");
#endif
    /* use Win32 "binary" mode by default since we don't want the
     * translation that Win32 does by default */
#ifdef _WIN32
# ifdef _MSC_VER /* MS Visual Studio */
    _set_fmode( _O_BINARY );
# else  /* MinGW */
    {
#ifndef _fmode
        extern int _fmode;
#endif
        _fmode = _O_BINARY;
    }
# endif /* _MSC_VER */
#endif  /* _WIN32 */
#ifndef _WIN32
    /* long ago Pd used setuid to promote itself to real-time priority.
    Just in case anyone's installation script still makes it setuid, we
    complain to stderr and lose setuid here. */
    if (getuid() != geteuid())
    {
        fprintf(stderr, "warning: canceling setuid privilege\n");
        setuid(getuid());
    }
#endif  /* _WIN32 */
    if (socket_init())
        sys_sockerror("socket_init()");
    pd_init();                                  /* start the message system */
    sys_findprogdir(argv[0]);                   /* set sys_progname, guipath */
    for (i = noprefs = 0; i < argc; i++)    /* prescan ... */
    {
        /* for prefs override */
        if (!strcmp(argv[i], "-noprefs"))
            noprefs = 1;
        else if (!strcmp(argv[i], "-prefsfile") && i < argc-1)
            prefsfile = argv[i+1];
        /* for external scheduler (to ignore audio api in sys_loadpreferences) */
        else if (!strcmp(argv[i], "-schedlib") && i < argc-1)
            sys_externalschedlib = 1;
        else if (!strcmp(argv[i], "-h") || !strcmp(argv[i], "-help"))
        {
            sys_printusage();
            return (1);
        }
    }
    if (!noprefs)       /* load preferences before parsing args to allow ... */
        sys_loadpreferences(prefsfile, 1);  /* args to override prefs */
    if (sys_argparse(argc-1, argv+1))           /* parse cmd line args */
        return (1);
    if (sys_verbose || sys_version) fprintf(stderr, "%s compiled %s %s\n",
        pd_version, pd_compiletime, pd_compiledate);
    if (sys_verbose)
        fprintf(stderr, "float precision = %lu bits\n", sizeof(t_float)*8);
    if (sys_version)    /* if we were just asked our version, exit here. */
    {
        fflush(stderr);
        return (0);
    }
    sys_setsignalhandlers();
    sys_afterargparse();                    /* post-argparse settings */
    if (sys_dontstartgui)
        clock_set((sys_fakefromguiclk =
            clock_new(0, (t_method)sys_fakefromgui)), 0);
    else if (sys_startgui(sys_libdir->s_name)) /* start the gui */
        return (1);
    if (sys_hipriority)
        sys_setrealtime(sys_libdir->s_name); /* set desired process priority */
    if (sys_externalschedlib)
        return (sys_run_scheduler(sys_externalschedlibname,
            sys_extraflagsstring));
    else if (sys_batch)
        return (m_batchmain());
    else
    {
            /* open audio and MIDI */
        sys_reopen_midi();
        if (audio_shouldkeepopen())
            sys_reopen_audio();
            /* run scheduler until it quits */
        return (m_mainloop());
    }
}